

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  char cVar1;
  undefined1 n_00 [16];
  undefined1 value [16];
  detail *p_00;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  char *pcVar8;
  reference pcVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  char *__result;
  undefined8 in_stack_fffffffffffffc38;
  undefined8 in_stack_fffffffffffffc40;
  basic_string_view<char> *this_00;
  anon_class_16_2_3f014a30 local_370;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_360;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_358;
  char *local_350;
  char *data;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  int local_334;
  detail *pdStack_330;
  int i;
  char *p;
  int local_31c;
  undefined1 local_318 [4];
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  detail local_c8 [8];
  char digits [40];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator group;
  int n;
  int size;
  int num_digits;
  char local_49 [8];
  char sep;
  void *local_38;
  undefined1 local_30 [8];
  string groups;
  int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this_local;
  
  local_38 = (this->locale).locale_;
  groups.field_2._8_8_ = this;
  grouping<char>((string *)local_30,(locale_ref)local_38);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30);
  if (bVar2) {
    on_dec(this);
    local_49[1] = '\x01';
    local_49[2] = '\0';
    local_49[3] = '\0';
    local_49[4] = '\0';
  }
  else {
    local_49[0] = thousands_sep<char>((locale_ref)(this->locale).locale_);
    if (local_49[0] == '\0') {
      on_dec(this);
      local_49[1] = '\x01';
      local_49[2] = '\0';
      local_49[3] = '\0';
      local_49[4] = '\0';
    }
    else {
      n_00._8_8_ = in_stack_fffffffffffffc40;
      n_00._0_8_ = in_stack_fffffffffffffc38;
      iVar5 = count_digits(*(detail **)&this->abs_value,(uint128_t)n_00);
      group._M_current._0_4_ = iVar5;
      group._M_current._4_4_ = iVar5;
      local_88._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   cbegin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_30);
      while( true ) {
        local_90._M_current =
             (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::cend((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30);
        bVar3 = __gnu_cxx::
                operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          (&local_88,&local_90);
        iVar6 = (int)group._M_current;
        bVar2 = false;
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          bVar2 = false;
          if (*pcVar9 < iVar6) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_88);
            bVar2 = false;
            if ('\0' < *pcVar9) {
              pcVar9 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_88);
              cVar1 = *pcVar9;
              cVar4 = max_value<char>();
              bVar2 = cVar1 != cVar4;
            }
          }
        }
        if (!bVar2) break;
        group._M_current._4_4_ = group._M_current._4_4_ + 1;
        pcVar9 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        group._M_current._0_4_ = (int)group._M_current - *pcVar9;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_88);
      }
      local_98._M_current =
           (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   cend((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_30);
      bVar2 = __gnu_cxx::
              operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        (&local_88,&local_98);
      if (bVar2) {
        iVar6 = (int)group._M_current + -1;
        pvVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30)
        ;
        group._M_current._4_4_ = iVar6 / (int)*pvVar7 + group._M_current._4_4_;
      }
      value._8_8_ = in_stack_fffffffffffffc40;
      value._0_8_ = in_stack_fffffffffffffc38;
      join_0x00000010_0x00000000_ =
           format_decimal<char,unsigned__int128>
                     (local_c8,*(char **)&this->abs_value,(unsigned___int128)value,
                      (int)*(undefined8 *)((long)&this->abs_value + 8));
      std::allocator<char>::allocator();
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize,
                 (allocator<char> *)((long)&s.size_ + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&s.size_ + 7));
      group._M_current._4_4_ = group._M_current._4_4_ + this->prefix_size;
      s.size_._0_4_ = to_unsigned<int>(group._M_current._4_4_);
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize,
                 (ulong)(type)s.size_);
      basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_318,local_49,1);
      local_31c = 0;
      p = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  cbegin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_30);
      local_88._M_current = p;
      pcVar8 = buffer<char>::data((buffer<char> *)&usize);
      pdStack_330 = (detail *)(pcVar8 + (long)group._M_current._4_4_ + -1);
      local_334 = iVar5;
      while (local_334 = local_334 + -1, 0 < local_334) {
        *pdStack_330 = local_c8[local_334];
        pdStack_330 = pdStack_330 + -1;
        pcVar9 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        if ('\0' < *pcVar9) {
          iVar5 = local_31c + 1;
          local_31c = iVar5;
          pcVar9 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_88);
          if (iVar5 % (int)*pcVar9 == 0) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_88);
            cVar1 = *pcVar9;
            cVar4 = max_value<char>();
            if (cVar1 != cVar4) {
              local_340 = __gnu_cxx::
                          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator+(&local_88,1);
              data = (char *)std::__cxx11::
                             basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::cend
                                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_30);
              bVar2 = __gnu_cxx::
                      operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                (&local_340,
                                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&data);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                local_31c = 0;
                __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator++(&local_88);
              }
              this_00 = (basic_string_view<char> *)local_318;
              pcVar8 = basic_string_view<char>::data(this_00);
              pcVar10 = basic_string_view<char>::data(this_00);
              sVar11 = basic_string_view<char>::size(this_00);
              p_00 = pdStack_330;
              sVar12 = basic_string_view<char>::size(this_00);
              __result = make_checked<char>((char *)p_00,sVar12);
              std::uninitialized_copy<char_const*,char*>(pcVar8,pcVar10 + sVar11,__result);
              sVar11 = basic_string_view<char>::size((basic_string_view<char> *)local_318);
              pdStack_330 = pdStack_330 + -sVar11;
            }
          }
        }
      }
      *pdStack_330 = local_c8[0];
      if (this->prefix_size != 0) {
        pdStack_330[-1] = (detail)0x2d;
      }
      pdStack_330 = pdStack_330 + -1;
      local_370.data = buffer<char>::data((buffer<char> *)&usize);
      local_360.container =
           (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
      local_370.size = group._M_current._4_4_;
      local_350 = local_370.data;
      local_358.container =
           (buffer<char> *)
           write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,char,unsigned__int128>::on_num()::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                     (local_360.container,this->specs,(ulong)(type)s.size_,(ulong)(type)s.size_,
                      &local_370);
      (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
           local_358.container;
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
                ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&usize);
      local_49[1] = '\0';
      local_49[2] = '\0';
      local_49[3] = '\0';
      local_49[4] = '\0';
    }
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }